

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O1

void __thiscall zsummer::log4z::LoggerInfo::LoggerInfo(LoggerInfo *this)

{
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_pid)._M_dataplus._M_p = (pointer)&(this->_pid).field_2;
  (this->_pid)._M_string_length = 0;
  (this->_pid).field_2._M_local_buf[0] = '\0';
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  (this->_path)._M_string_length = 0;
  (this->_path).field_2._M_local_buf[0] = '\0';
  (this->_handle).m_file = (FILE *)0x0;
  std::__cxx11::string::_M_replace((ulong)&this->_path,0,(char *)0x0,0x1327f3);
  this->_level = 0;
  this->_display = true;
  this->_monthdir = false;
  this->_enable = false;
  this->_limitsize = 100;
  this->_curFileCreateTime = 0;
  this->_curFileIndex = 0;
  this->_curWriteLen = 0;
  return;
}

Assistant:

LoggerInfo()
	{
		SetDefaultInfo();
		_curFileCreateTime = 0;
		_curFileIndex = 0;
		_curWriteLen = 0;
	}